

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

void __thiscall llm_graph_input_s_copy::set_input(llm_graph_input_s_copy *this,llama_ubatch *ubatch)

{
  uint uVar1;
  llama_kv_cache_unified *plVar2;
  void *pvVar3;
  pointer plVar4;
  char cVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  if (this->s_copy != (ggml_tensor *)0x0) {
    uVar1 = this->kv_self->n;
    cVar5 = ggml_backend_buffer_is_host(this->s_copy->buffer);
    if (cVar5 == '\0') {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x10c,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(s_copy->buffer)");
    }
    plVar2 = this->kv_self;
    pvVar3 = this->s_copy->data;
    lVar6 = 8;
    for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
      uVar8 = plVar2->head + (int)uVar7;
      plVar4 = (plVar2->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = *(uint *)((long)&plVar4->pos + lVar6);
      if (((int)uVar9 < 0) || (plVar2->size <= uVar9)) {
        *(uint *)((long)&plVar4->pos + lVar6) = uVar8;
        uVar9 = uVar8;
      }
      *(uint *)((long)pvVar3 + uVar7 * 4) = uVar9;
      if (uVar8 != *(uint *)((long)&plVar4->pos + lVar6)) {
        *(uint *)((long)&plVar4->pos + lVar6) = uVar8;
      }
      lVar6 = lVar6 + 0x40;
    }
  }
  return;
}

Assistant:

void llm_graph_input_s_copy::set_input(const llama_ubatch * ubatch) {
    GGML_UNUSED(ubatch);

    const int64_t n_kv = kv_self->n;

    if (s_copy) {
        GGML_ASSERT(ggml_backend_buffer_is_host(s_copy->buffer));
        int32_t * data = (int32_t *) s_copy->data;

        // assuming copy destinations ALWAYS happen ONLY on the cells between head and head+n
        for (uint32_t i = 0; i < n_kv; ++i) {
            const uint32_t  cell_id = i + kv_self->head;

            //////////////////////////////////////////////
            // TODO: this should not mutate the KV cache !
            llama_kv_cell & kv_cell = const_cast<class llama_kv_cache_unified *>(kv_self)->cells[i];

            // prevent out-of-bound sources
            if (kv_cell.src < 0 || (uint32_t) kv_cell.src >= kv_self->size) {
                kv_cell.src = cell_id;
            }

            data[i] = kv_cell.src;

            // TODO: do not mutate the KV cache
            // ensure copy only happens once
            if (kv_cell.src != (int32_t) cell_id) {
                kv_cell.src = cell_id;
            }
        }
    }
}